

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SudokuGitter.cpp
# Opt level: O2

void __thiscall SudokuGitter::print(SudokuGitter *this)

{
  ostream *poVar1;
  uint icol;
  ulong uVar2;
  uint irow;
  ulong uVar3;
  
  for (uVar3 = 0; uVar3 < this->elements; uVar3 = uVar3 + 1) {
    std::operator<<((ostream *)&std::cout," ");
    for (uVar2 = 0; uVar2 < this->elements; uVar2 = uVar2 + 1) {
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::operator<<(poVar1," ");
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  return;
}

Assistant:

void SudokuGitter::print() {
    for (unsigned int irow = 0; irow < getElements(); ++irow) {
        std::cout << " ";
        for (unsigned int icol = 0; icol < getElements(); ++icol) {
            std::cout << getCellValue(irow, icol) << " ";
        }
        std::cout << std::endl; // << "--" << std::endl;
    }
}